

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  cmMakefile *this_00;
  byte bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_440 [32];
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  undefined1 local_3d8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string local_388;
  allocator<char> local_361;
  undefined1 local_360 [8];
  string remove;
  undefined1 local_320 [8];
  string fc;
  string *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_2c0 [8];
  ofstream fout;
  string cleanfilePath;
  undefined1 local_70 [8];
  string cleanfile;
  string currentBinDir;
  char *filename_local;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(cleanfile.field_2._M_local_buf + 8),(string *)psVar3);
  std::__cxx11::string::string((string *)local_70,(string *)(cleanfile.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_70,"/");
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
            ((undefined1 *)((long)&cleanfilePath.field_2 + 8),this,target);
  std::__cxx11::string::operator+=
            ((string *)local_70,(string *)(cleanfilePath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(cleanfilePath.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_70,"/cmake_clean");
  if (filename != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)local_70,"_");
    std::__cxx11::string::operator+=((string *)local_70,filename);
  }
  std::__cxx11::string::operator+=((string *)local_70,".cmake");
  cmsys::SystemTools::CollapseFullPath((string *)&fout.field_0x1f8,(string *)local_70);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_2c0,pcVar4,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_2c0 + (long)*(_func_int **)((long)local_2c0 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "Could not create ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fout.field_0x1f8);
    cmSystemTools::Error((string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(files);
  if (!bVar2) {
    std::operator<<((ostream *)local_2c0,"file(REMOVE_RECURSE\n");
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      fc.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)local_320,(cmLocalGenerator *)this,
                 (string *)((long)&cleanfile.field_2 + 8),(string *)fc.field_2._8_8_);
      poVar5 = std::operator<<((ostream *)local_2c0,"  ");
      cmOutputConverter::EscapeForCMake((string *)((long)&remove.field_2 + 8),(string *)local_320);
      poVar5 = std::operator<<(poVar5,(string *)(remove.field_2._M_local_buf + 8));
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)(remove.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_320);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)local_2c0,")\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_360,"$(CMAKE_COMMAND) -P ",&local_361);
  std::allocator<char>::~allocator(&local_361);
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (cmLocalGenerator *)this,psVar3,(string *)local_70);
  cmOutputConverter::ConvertToOutputFormat
            (&local_388,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count,SHELL);
  std::__cxx11::string::operator+=((string *)local_360,(string *)&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string
            ((string *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(commands,(value_type *)local_360);
  std::__cxx11::string::~string((string *)local_360);
  if (filename == (char *)0x0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_3d8);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"CMAKE_BUILD_TYPE",&local_3f9);
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_3f8);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3d8,psVar3);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    poVar5 = std::operator<<((ostream *)local_2c0,"\n");
    poVar5 = std::operator<<(poVar5,"# Per-language clean rules from dependency scanning.\n");
    poVar5 = std::operator<<(poVar5,"foreach(lang ");
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_420,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3d8," ");
    poVar5 = std::operator<<(poVar5,(string *)&local_420);
    poVar5 = std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(poVar5,"  include(");
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
              (local_440,this,target);
    poVar5 = std::operator<<(poVar5,local_440);
    poVar5 = std::operator<<(poVar5,"/cmake_clean_${lang}.cmake OPTIONAL)\n");
    std::operator<<(poVar5,"endforeach()\n");
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string((string *)&local_420);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3d8);
  }
  std::ofstream::~ofstream(local_2c0);
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(cleanfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::vector<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinDir;
  cleanfile += "/";
  cleanfile += this->GetTargetDirectory(target);
  cleanfile += "/cmake_clean";
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
  cmsys::ofstream fout(cleanfilePath.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfilePath);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeConvertToRelativePath(currentBinDir, file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->GetCurrentBinaryDirectory(),
                                       cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}